

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityDestinationRecord *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EntityDestinationRecord *local_18;
  EntityDestinationRecord *this_local;
  
  local_18 = this;
  this_local = (EntityDestinationRecord *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Entity Destination Record\n");
  poVar1 = std::operator<<(poVar1,"Entity ID:\n");
  EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_Entity);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"Device ID:           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16DstCommsDvcID);
  poVar1 = std::operator<<(poVar1,"\nLine ID:             ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DstLineID);
  poVar1 = std::operator<<(poVar1,"\nPriority:            ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8DstPriority);
  poVar1 = std::operator<<(poVar1,"\nLine State Command:  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LnStCmd);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityDestinationRecord::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Destination Record\n"
       << "Entity ID:\n"          << IndentString( m_Entity.GetAsString(), 1 )
       << "Device ID:           " << m_ui16DstCommsDvcID
       << "\nLine ID:             " << ( KUINT16 )m_ui8DstLineID
       << "\nPriority:            " << ( KUINT16 )m_ui8DstPriority
       << "\nLine State Command:  " << ( KUINT16 )m_ui8LnStCmd
       << "\n";

    return ss.str();
}